

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateSetIntegerProperty
               (HelicsFederate fed,int intProperty,int propVal,HelicsError *err)

{
  Federate *pFVar1;
  
  pFVar1 = getFed(fed,err);
  if (pFVar1 != (Federate *)0x0) {
    (*pFVar1->_vptr_Federate[6])(pFVar1,(ulong)(uint)intProperty,(ulong)(uint)propVal);
  }
  return;
}

Assistant:

void helicsFederateSetIntegerProperty(HelicsFederate fed, int intProperty, int propVal, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->setProperty(intProperty, propVal);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}